

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O1

void __thiscall libcalc::Tokenizer::Tokenizer(Tokenizer *this,string *expression)

{
  pointer pcVar1;
  string local_40;
  
  (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (expression->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + expression->_M_string_length);
  parse(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

Tokenizer::Tokenizer(std::string expression) {
  parse(expression);
}